

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigMiter.c
# Opt level: O3

int Saig_ManDemiterNew(Aig_Man_t *pMan)

{
  void *pvVar1;
  int iVar2;
  Vec_Ptr_t *vSuper;
  void **__ptr;
  Vec_Ptr_t *pVVar3;
  uint uVar4;
  ulong uVar5;
  char *pcVar6;
  long lVar7;
  ulong uVar8;
  Aig_Obj_t *pFan1;
  Aig_Obj_t *pFan0;
  Aig_Obj_t *local_40;
  Aig_Obj_t *local_38;
  
  vSuper = (Vec_Ptr_t *)malloc(0x10);
  vSuper->nCap = 100;
  vSuper->nSize = 0;
  __ptr = (void **)malloc(800);
  vSuper->pArray = __ptr;
  uVar5 = (ulong)(uint)pMan->nTruePos;
  if (0 < pMan->nTruePos) {
    uVar8 = 0;
    do {
      if ((long)pMan->vCos->nSize <= (long)uVar8) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      if ((pMan->nConstrs != 0) && ((long)((int)uVar5 - pMan->nConstrs) <= (long)uVar8)) break;
      pvVar1 = pMan->vCos->pArray[uVar8];
      printf("Output %3d : ",uVar8 & 0xffffffff);
      uVar5 = *(ulong *)((long)pvVar1 + 8);
      uVar4 = (uint)*(undefined8 *)&((Aig_Obj_t *)(uVar5 & 0xfffffffffffffffe))->field_0x18;
      if ((uVar4 & 7) == 1) {
        if ((uVar5 & 1) == 0) {
          pcVar6 = "Const1";
        }
        else {
          pcVar6 = "Const0";
        }
LAB_006edc37:
        puts(pcVar6);
      }
      else {
        if ((uVar4 & 7) - 7 < 0xfffffffe) {
          pcVar6 = "Terminal";
          goto LAB_006edc37;
        }
        if ((uVar5 & 1) == 0) {
          printf("AND  ");
          iVar2 = Aig_ObjRecognizeExor
                            ((Aig_Obj_t *)(*(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe),
                             &local_38,&local_40);
          pcVar6 = " Yes";
          if (iVar2 == 0) {
            pcVar6 = " No";
          }
LAB_006edc7e:
          printf(pcVar6);
        }
        else {
          Aig_ObjCollectSuper((Aig_Obj_t *)(uVar5 & 0xfffffffffffffffe),vSuper);
          printf("OR with %d inputs    ",(ulong)(uint)vSuper->nSize);
          if (vSuper->nSize == 2) {
            iVar2 = Aig_ObjRecognizeExor
                              ((Aig_Obj_t *)(*(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe),
                               &local_38,&local_40);
            if (iVar2 == 0) {
              pcVar6 = " No";
              goto LAB_006edc7e;
            }
            printf(" Yes");
            putchar(10);
            pVVar3 = Aig_Support(pMan,(Aig_Obj_t *)((ulong)local_38 & 0xfffffffffffffffe));
            iVar2 = pVVar3->nSize;
            if (0 < iVar2) {
              lVar7 = 0;
              do {
                if (((*(uint *)((long)pVVar3->pArray[lVar7] + 0x18) & 7) == 2) &&
                   (pMan->nTruePis <= *pVVar3->pArray[lVar7])) {
                  printf(" %d");
                  iVar2 = pVVar3->nSize;
                }
                lVar7 = lVar7 + 1;
              } while (lVar7 < iVar2);
            }
            putchar(10);
            if (pVVar3->pArray != (void **)0x0) {
              free(pVVar3->pArray);
            }
            free(pVVar3);
            pVVar3 = Aig_Support(pMan,(Aig_Obj_t *)((ulong)local_40 & 0xfffffffffffffffe));
            iVar2 = pVVar3->nSize;
            if (0 < iVar2) {
              lVar7 = 0;
              do {
                if (((*(uint *)((long)pVVar3->pArray[lVar7] + 0x18) & 7) == 2) &&
                   (pMan->nTruePis <= *pVVar3->pArray[lVar7])) {
                  printf(" %d");
                  iVar2 = pVVar3->nSize;
                }
                lVar7 = lVar7 + 1;
              } while (lVar7 < iVar2);
            }
            putchar(10);
            if (pVVar3->pArray != (void **)0x0) {
              free(pVVar3->pArray);
            }
            free(pVVar3);
          }
        }
        putchar(10);
      }
      uVar8 = uVar8 + 1;
      uVar5 = (ulong)pMan->nTruePos;
    } while ((long)uVar8 < (long)uVar5);
    __ptr = vSuper->pArray;
  }
  if (__ptr != (void **)0x0) {
    free(__ptr);
  }
  free(vSuper);
  return 1;
}

Assistant:

int Saig_ManDemiterNew( Aig_Man_t * pMan )
{
    Vec_Ptr_t * vSuper, * vSupp0, * vSupp1;
    Aig_Obj_t * pObj, * pTemp, * pFan0, * pFan1;
    int i, k;
    vSuper = Vec_PtrAlloc( 100 );
    Saig_ManForEachPo( pMan, pObj, i )
    {
        if ( pMan->nConstrs && i >= Saig_ManPoNum(pMan) - pMan->nConstrs )
            break;
        printf( "Output %3d : ", i );
        if ( Aig_ObjIsConst1(Aig_ObjFanin0(pObj)) )
        {
            if ( !Aig_ObjFaninC0(pObj) )
                printf( "Const1\n" );
            else
                printf( "Const0\n" );
            continue;
        }
        if ( !Aig_ObjIsNode(Aig_ObjFanin0(pObj)) )
        {
            printf( "Terminal\n" );
            continue;
        }
        // check AND
        if ( !Aig_ObjFaninC0(pObj) )
        { 
            printf( "AND  " );
            if ( Aig_ObjRecognizeExor(Aig_ObjFanin0(pObj), &pFan0, &pFan1) )
                printf( " Yes" );
            else
                printf( " No" );
            printf( "\n" );
            continue;
        }
        // check OR
        Aig_ObjCollectSuper( Aig_ObjFanin0(pObj), vSuper );
        printf( "OR with %d inputs    ", Vec_PtrSize(vSuper) );
        if ( Vec_PtrSize(vSuper) == 2 )
        {
            if ( Aig_ObjRecognizeExor(Aig_ObjFanin0(pObj), &pFan0, &pFan1) )
            {
                printf( " Yes" );
                printf( "\n" );

                vSupp0 = Aig_Support( pMan, Aig_Regular(pFan0) );
                Vec_PtrForEachEntry( Aig_Obj_t *, vSupp0, pTemp, k )
                    if ( Saig_ObjIsLo(pMan, pTemp) )
                        printf( " %d", Aig_ObjCioId(pTemp) );
                printf( "\n" );
                Vec_PtrFree( vSupp0 );

                vSupp1 = Aig_Support( pMan, Aig_Regular(pFan1) );
                Vec_PtrForEachEntry( Aig_Obj_t *, vSupp1, pTemp, k )
                    if ( Saig_ObjIsLo(pMan, pTemp) )
                        printf( " %d", Aig_ObjCioId(pTemp) );
                printf( "\n" );
                Vec_PtrFree( vSupp1 );
            }
            else
                printf( " No" );
            printf( "\n" );
            continue;
        }
/*
        Vec_PtrForEachEntry( Aig_Obj_t *, vSuper, pTemp, k )
            if ( Aig_ObjRecognizeExor(Aig_Regular(pTemp), &pFan0, &pFan1) )
            {
                printf( " Yes" );
                if ( Aig_IsComplement(pTemp) )
                    pFan0 = Aig_Not(pFan0);
            }
            else
                printf( " No" );
*/
        printf( "\n" );
    }
    Vec_PtrFree( vSuper );
    return 1;
}